

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsRunScriptWithParserState
          (JsValueRef script,JsSourceContext sourceContext,JsValueRef sourceUrl,
          JsParseScriptAttributes parseAttributes,JsValueRef parserState,JsValueRef *result)

{
  bool bVar1;
  JsErrorCode JVar2;
  WCHAR *url;
  
  if (((ulong)sourceUrl >> 0x30 == 0 && sourceUrl != (JsValueRef)0x0) &&
     (bVar1 = Js::VarIsImpl<Js::JavascriptString>((RecyclableObject *)sourceUrl), bVar1)) {
    url = (WCHAR *)(**(code **)(*sourceUrl + 0x328))();
    JVar2 = RunScriptWithParserStateCore
                      (0,script,sourceContext,url,parseAttributes,parserState,false,result);
    return JVar2;
  }
  return JsErrorInvalidArgument;
}

Assistant:

CHAKRA_API JsRunScriptWithParserState(
    _In_ JsValueRef script,
    _In_ JsSourceContext sourceContext,
    _In_ JsValueRef sourceUrl,
    _In_ JsParseScriptAttributes parseAttributes,
    _In_ JsValueRef parserState,
    _Out_ JsValueRef *result)
{
    WCHAR *url = nullptr;
    if (sourceUrl && Js::VarIs<Js::JavascriptString>(sourceUrl))
    {
        url = const_cast<WCHAR*>(((Js::JavascriptString*)(sourceUrl))->GetSz());
        return RunScriptWithParserStateCore(0, script, sourceContext, url, parseAttributes, parserState, false, result);
    }
    else
    {
        return JsErrorInvalidArgument;
    }
}